

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                    *this,sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                          *other,allocator<std::pair<std::type_index,_std::any>_> *alloc)

{
  EntryPointer psVar1;
  float fVar2;
  char cVar3;
  EntryPointer psVar4;
  size_t sVar5;
  sherwood_v3_entry<std::pair<std::type_index,_std::any>_> *psVar6;
  long lVar7;
  ulong uVar8;
  ulong num_buckets;
  EntryPointer psVar9;
  double dVar10;
  
  psVar6 = empty_default_table<std::pair<std::type_index,std::any>>();
  this->entries = psVar6;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  fVar2 = other->_max_load_factor;
  this->_max_load_factor = fVar2;
  this->num_elements = 0;
  dVar10 = (double)fVar2;
  if (0.5 <= dVar10) {
    dVar10 = 0.5;
  }
  dVar10 = ceil((((double)CONCAT44(0x45300000,(int)(other->num_elements >> 0x20)) -
                 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)other->num_elements) - 4503599627370496.0)) /
                dVar10);
  uVar8 = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
  num_buckets = other->num_slots_minus_one + 1;
  if (other->num_slots_minus_one == 0) {
    num_buckets = 0;
  }
  if (uVar8 <= num_buckets) {
    num_buckets = uVar8;
  }
  rehash(this,num_buckets);
  psVar4 = other->entries;
  psVar9 = psVar4 + -1;
  lVar7 = 0x20;
  do {
    lVar7 = lVar7 + -0x20;
    psVar1 = psVar9 + 1;
    psVar9 = psVar9 + 1;
  } while (psVar1->distance_from_desired < '\0');
  sVar5 = other->num_slots_minus_one;
  cVar3 = other->max_lookups;
  if (lVar7 + (long)cVar3 * 0x20 + sVar5 * 0x20 != 0) {
    do {
      sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
      ::emplace<std::pair<std::type_index,std::any>const&>
                ((sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
                  *)this,&(psVar9->field_1).value);
      do {
        psVar1 = psVar9 + 1;
        psVar9 = psVar9 + 1;
      } while (psVar1->distance_from_desired < '\0');
    } while (psVar9 != psVar4 + sVar5 + (long)cVar3);
  }
  return;
}

Assistant:

sherwood_v3_table(const sherwood_v3_table & other, const ArgumentAlloc & alloc)
        : EntryAlloc(alloc), Hasher(other), Equal(other), _max_load_factor(other._max_load_factor)
    {
        rehash_for_other_container(other);
        try
        {
            insert(other.begin(), other.end());
        }
        catch(...)
        {
            clear();
            deallocate_data(entries, num_slots_minus_one, max_lookups);
            throw;
        }
    }